

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  element_type *peVar1;
  FailureReporterInterface *pFVar2;
  element_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<testing::internal::ExpectationBase> *an_expectation_base;
  bool bVar4;
  Expectation EVar5;
  long *local_40 [2];
  long local_30 [2];
  
  an_expectation_base =
       *(shared_ptr<testing::internal::ExpectationBase> **)((long)&(exp->source_text_).field_2 + 8);
  bVar4 = an_expectation_base ==
          *(shared_ptr<testing::internal::ExpectationBase> **)&exp->cardinality_specified_;
  if (!bVar4) {
    peVar1 = (an_expectation_base->
             super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    while (peVar1 != in_RDX) {
      an_expectation_base = an_expectation_base + 1;
      bVar4 = an_expectation_base ==
              *(shared_ptr<testing::internal::ExpectationBase> **)&exp->cardinality_specified_;
      if (bVar4) goto LAB_0018db5d;
      peVar1 = (an_expectation_base->
               super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
    }
    Expectation::Expectation((Expectation *)this,an_expectation_base);
    _Var3._M_pi = extraout_RDX;
    if (!bVar4) goto LAB_0018dbc1;
  }
LAB_0018db5d:
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Cannot find expectation.","");
  pFVar2 = GetFailureReporter();
  (*pFVar2->_vptr_FailureReporterInterface[2])
            (pFVar2,1,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googlemock/src/gmock-spec-builders.cc"
             ,0x1f0,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  Expectation::Expectation((Expectation *)this);
  _Var3._M_pi = extraout_RDX_00;
LAB_0018dbc1:
  EVar5.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  EVar5.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Expectation)
         EVar5.expectation_base_.
         super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}